

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sort.h
# Opt level: O2

void stable_grail_build_blocks(int **arr,int L,int K,int **extbuf,int LExtBuf)

{
  int *piVar1;
  int **ppiVar2;
  uint uVar3;
  uint uVar4;
  int iVar5;
  int iVar6;
  size_t __n;
  int iVar7;
  long lVar8;
  int **ppiVar9;
  ulong uVar10;
  long lVar11;
  long lVar12;
  
  if (K < LExtBuf) {
    LExtBuf = K;
  }
  do {
    uVar4 = LExtBuf;
    LExtBuf = uVar4 - 1 & uVar4;
  } while (LExtBuf != 0);
  lVar11 = (long)L;
  if (uVar4 == 0) {
    ppiVar2 = arr;
    for (lVar8 = 1; lVar8 < lVar11; lVar8 = lVar8 + 2) {
      piVar1 = ppiVar2[-2];
      uVar10 = (ulong)(*ppiVar2[1] < **ppiVar2);
      ppiVar2[-2] = ppiVar2[uVar10];
      ppiVar2[uVar10] = piVar1;
      piVar1 = ppiVar2[-1];
      ppiVar2[-1] = ppiVar2[1 - uVar10];
      ppiVar2[1 - uVar10] = piVar1;
      ppiVar2 = ppiVar2 + 2;
    }
    if ((L & 1U) != 0) {
      piVar1 = arr[lVar11 + -1];
      arr[lVar11 + -1] = arr[lVar11 + -3];
      arr[lVar11 + -3] = piVar1;
    }
    ppiVar2 = arr + -2;
    uVar10 = 2;
  }
  else {
    __n = (long)(int)uVar4 * 8;
    memcpy(extbuf,arr + -(long)(int)uVar4,__n);
    ppiVar2 = arr;
    for (lVar8 = 1; lVar8 < lVar11; lVar8 = lVar8 + 2) {
      iVar7 = **ppiVar2;
      iVar6 = *ppiVar2[1];
      ppiVar2[-2] = ppiVar2[iVar6 < iVar7];
      ppiVar2[-1] = ppiVar2[1 - (ulong)(iVar6 < iVar7)];
      ppiVar2 = ppiVar2 + 2;
    }
    if ((L & 1U) != 0) {
      arr[lVar11 + -3] = arr[lVar11 + -1];
    }
    ppiVar2 = arr + -2;
    uVar10 = 2;
    while (iVar6 = (int)uVar10, iVar6 < (int)uVar4) {
      uVar3 = iVar6 * 2;
      iVar5 = -iVar6;
      lVar8 = 0;
      ppiVar9 = ppiVar2;
      iVar7 = L;
      for (lVar12 = 0; lVar12 <= L + iVar6 * -2; lVar12 = lVar12 + (int)uVar3) {
        stable_grail_merge_left_with_x_buf(ppiVar9,iVar6,iVar6,iVar5);
        lVar8 = lVar8 + (uVar10 << 0x21);
        iVar7 = iVar7 + iVar6 * -2;
        ppiVar9 = ppiVar9 + (int)uVar3;
      }
      if (iVar6 < iVar7) {
        stable_grail_merge_left_with_x_buf
                  ((int **)((lVar8 >> 0x1d) + (long)ppiVar2),iVar6,iVar7 + iVar5,iVar5);
      }
      else {
        for (; lVar12 < lVar11; lVar12 = lVar12 + 1) {
          ppiVar2[lVar12 - iVar6] = ppiVar2[lVar12];
        }
      }
      ppiVar2 = ppiVar2 + -(long)iVar6;
      uVar10 = (ulong)uVar3;
    }
    memcpy(ppiVar2 + lVar11,extbuf,__n);
  }
  while (iVar6 = (int)uVar10, iVar6 < K) {
    uVar4 = iVar6 * 2;
    iVar5 = -iVar6;
    lVar11 = 0;
    ppiVar9 = ppiVar2;
    iVar7 = L;
    for (lVar8 = 0; lVar8 <= L + iVar6 * -2; lVar8 = lVar8 + (int)uVar4) {
      stable_grail_merge_left(ppiVar9,iVar6,iVar6,iVar5);
      lVar11 = lVar11 + (uVar10 << 0x21);
      iVar7 = iVar7 + iVar6 * -2;
      ppiVar9 = ppiVar9 + (int)uVar4;
    }
    ppiVar9 = (int **)((lVar11 >> 0x1d) + (long)ppiVar2);
    if (iVar6 < iVar7) {
      stable_grail_merge_left(ppiVar9,iVar6,iVar7 + iVar5,iVar5);
    }
    else {
      stable_grail_rotate(ppiVar9 + -(long)iVar6,iVar6,iVar7);
    }
    ppiVar2 = ppiVar2 + -(long)iVar6;
    uVar10 = (ulong)uVar4;
  }
  iVar6 = L % (K * 2);
  iVar7 = L - iVar6;
  if (iVar6 - K == 0 || iVar6 < K) {
    stable_grail_rotate(ppiVar2 + iVar7,iVar6,K);
  }
  else {
    stable_grail_merge_right(ppiVar2 + iVar7,K,iVar6 - K,K);
  }
  for (; 0 < iVar7; iVar7 = iVar7 + K * -2) {
    stable_grail_merge_right(ppiVar2 + (K * -2 + iVar7),K,K,K);
  }
  return;
}

Assistant:

static void GRAIL_BUILD_BLOCKS(SORT_TYPE *arr, int L, int K, SORT_TYPE *extbuf,
                               int LExtBuf) {
  int m, u, h, p0, p1, rest, restk, p, kbuf;
  kbuf = K < LExtBuf ? K : LExtBuf;

  while (kbuf & (kbuf - 1)) {
    kbuf &= kbuf - 1; /* max power or 2 - just in case */
  }

  if (kbuf) {
    SORT_TYPE_CPY(extbuf, arr - kbuf, kbuf);

    for (m = 1; m < L; m += 2) {
      u = 0;

      if (SORT_CMP_A(arr + (m - 1), arr + m) > 0) {
        u = 1;
      }

      arr[m - 3] = arr[m - 1 + u];
      arr[m - 2] = arr[m - u];
    }

    if (L % 2) {
      arr[L - 3] = arr[L - 1];
    }

    arr -= 2;

    for (h = 2; h < kbuf; h *= 2) {
      p0 = 0;
      p1 = L - 2 * h;

      while (p0 <= p1) {
        GRAIL_MERGE_LEFT_WITH_X_BUF(arr + p0, h, h, -h);
        p0 += 2 * h;
      }

      rest = L - p0;

      if (rest > h) {
        GRAIL_MERGE_LEFT_WITH_X_BUF(arr + p0, h, rest - h, -h);
      } else {
        for (; p0 < L; p0++) {
          arr[p0 - h] = arr[p0];
        }
      }

      arr -= h;
    }

    SORT_TYPE_CPY(arr + L, extbuf, kbuf);
  } else {
    for (m = 1; m < L; m += 2) {
      u = 0;

      if (SORT_CMP_A(arr + (m - 1), arr + m) > 0) {
        u = 1;
      }

      GRAIL_SWAP1(arr + (m - 3), arr + (m - 1 + u));
      GRAIL_SWAP1(arr + (m - 2), arr + (m - u));
    }

    if (L % 2) {
      GRAIL_SWAP1(arr + (L - 1), arr + (L - 3));
    }

    arr -= 2;
    h = 2;
  }

  for (; h < K; h *= 2) {
    p0 = 0;
    p1 = L - 2 * h;

    while (p0 <= p1) {
      GRAIL_MERGE_LEFT(arr + p0, h, h, -h);
      p0 += 2 * h;
    }

    rest = L - p0;

    if (rest > h) {
      GRAIL_MERGE_LEFT(arr + p0, h, rest - h, -h);
    } else {
      GRAIL_ROTATE(arr + p0 - h, h, rest);
    }

    arr -= h;
  }

  restk = L % (2 * K);
  p = L - restk;

  if (restk <= K) {
    GRAIL_ROTATE(arr + p, restk, K);
  } else {
    GRAIL_MERGE_RIGHT(arr + p, K, restk - K, K);
  }

  while (p > 0) {
    p -= 2 * K;
    GRAIL_MERGE_RIGHT(arr + p, K, K, K);
  }
}